

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Tile<Color>::generate_reflection_map(Symmetry *symmetry)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  iterator puVar1;
  uint *in_RSI;
  allocator_type *in_RDI;
  allocator_type *paVar2;
  size_type in_stack_ffffffffffffff10;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 *local_a0;
  undefined8 local_98;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 *local_78;
  undefined8 local_70;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined8 local_50;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 *local_38;
  undefined8 local_30;
  undefined4 local_24;
  undefined4 *local_20;
  undefined8 local_18;
  
  puVar1 = (iterator)(ulong)*in_RSI;
  paVar2 = in_RDI;
  switch(puVar1) {
  case (iterator)0x0:
    local_24 = 0;
    local_20 = &local_24;
    local_18 = 1;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14b9db);
    __l._M_len = in_stack_ffffffffffffff10;
    __l._M_array = puVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paVar2,__l,in_RDI);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14ba09);
    break;
  case (iterator)0x1:
    local_88 = 0;
    local_84 = 3;
    local_80 = 2;
    local_7c = 1;
    local_78 = &local_88;
    local_70 = 4;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14bb56);
    __l_02._M_len = in_stack_ffffffffffffff10;
    __l_02._M_array = puVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paVar2,__l_02,in_RDI);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14bb84);
    break;
  case (iterator)0x2:
    local_40 = 0;
    local_3c = 1;
    local_38 = &local_40;
    local_30 = 2;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14ba52);
    __l_00._M_len = in_stack_ffffffffffffff10;
    __l_00._M_array = puVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paVar2,__l_00,in_RDI);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14ba80);
    break;
  case (iterator)0x3:
    local_b0 = 1;
    local_ac = 0;
    local_a8 = 3;
    local_a4 = 2;
    local_a0 = &local_b0;
    local_98 = 4;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14bbe3);
    __l_03._M_len = in_stack_ffffffffffffff10;
    __l_03._M_array = puVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paVar2,__l_03,in_RDI);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14bc11);
    break;
  case (iterator)0x4:
    local_60 = 1;
    local_5c = 0;
    local_58 = &local_60;
    local_50 = 2;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14bac9);
    __l_01._M_len = in_stack_ffffffffffffff10;
    __l_01._M_array = puVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paVar2,__l_01,in_RDI);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14baf7);
    break;
  case (iterator)0x5:
  default:
    local_d8 = 0x300000000;
    uStack_d0 = 0x100000002;
    local_e8 = 0x700000004;
    uStack_e0 = 0x500000006;
    local_c8 = &local_e8;
    local_c0 = 8;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x14bc4e);
    __l_04._M_len = in_stack_ffffffffffffff10;
    __l_04._M_array = puVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)paVar2,__l_04,in_RDI);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x14bc72);
  }
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)paVar2;
}

Assistant:

static std::vector<unsigned>
		generate_reflection_map(const Symmetry &symmetry) noexcept {
		switch (symmetry) {
		case Symmetry::X:
			return { 0 };
		case Symmetry::I:
			return { 0, 1 };
		case Symmetry::backslash:
			return { 1, 0 };
		case Symmetry::T:
			return { 0, 3, 2, 1 };
		case Symmetry::L:
			return { 1, 0, 3, 2 };
		case Symmetry::P:
		default:
			return { 4, 7, 6, 5, 0, 3, 2, 1 };
		}
	}